

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpg4d_api.c
# Opt level: O0

MPP_RET mpg4d_init(void *dec,ParserCfg *cfg)

{
  MppDecCfgSet *data;
  size_t stream_size;
  RK_U8 *stream;
  MPP_RET ret;
  Mpg4dCtx *p;
  MppPacket task_pkt;
  Mpg4dParser parser;
  ParserCfg *cfg_local;
  void *dec_local;
  
  task_pkt = (MppPacket)0x0;
  p = (Mpg4dCtx *)0x0;
  parser = cfg;
  cfg_local = (ParserCfg *)dec;
  if (dec == (void *)0x0) {
    _mpp_log_l(2,"mpg4d_api","found NULL intput dec %p cfg %p\n","mpg4d_init",0,cfg);
    dec_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    data = (MppDecCfgSet *)mpp_osal_malloc("mpg4d_init",0x10000);
    if (data == (MppDecCfgSet *)0x0) {
      _mpp_log_l(2,"mpg4d_api","failed to malloc stream buffer size %d\n","mpg4d_init",0x10000);
      dec_local._4_4_ = MPP_ERR_MALLOC;
    }
    else {
      stream._4_4_ = mpp_packet_init(&p,data,0x10000);
      if (stream._4_4_ == MPP_OK) {
        mpp_packet_set_pos(p,data);
        mpp_packet_set_length(p,0);
        stream._4_4_ = mpp_mpg4_parser_init(&task_pkt,(ParserCfg *)parser);
        if (stream._4_4_ == MPP_OK) {
          *(undefined8 *)cfg_local = *(undefined8 *)((long)parser + 8);
          cfg_local->frame_slots = *(MppBufSlots *)((long)parser + 0x10);
          *(undefined4 *)&cfg_local->packet_slots = 2;
          cfg_local[1].cfg = *(MppDecCfgSet **)((long)parser + 0x18);
          cfg_local->cfg = data;
          cfg_local->hw_info = (MppDecHwCap *)0x10000;
          cfg_local[1].frame_slots = p;
          cfg_local[1].hw_info = (MppDecHwCap *)task_pkt;
          *(undefined8 *)(cfg_local + 1) = 0;
          return MPP_OK;
        }
        _mpp_log_l(2,"mpg4d_api","failed to init parser\n","mpg4d_init");
      }
      else {
        _mpp_log_l(2,"mpg4d_api","failed to create mpp_packet for task\n","mpg4d_init");
      }
      if (p != (Mpg4dCtx *)0x0) {
        mpp_packet_deinit(&p);
      }
      if (data != (MppDecCfgSet *)0x0) {
        mpp_osal_free("mpg4d_init",data);
      }
      dec_local._4_4_ = stream._4_4_;
    }
  }
  return dec_local._4_4_;
}

Assistant:

static MPP_RET mpg4d_init(void *dec, ParserCfg *cfg)
{
    Mpg4dParser parser = NULL;
    MppPacket task_pkt = NULL;
    Mpg4dCtx *p;
    MPP_RET ret;
    RK_U8 *stream;
    size_t stream_size = MPG4D_INIT_STREAM_SIZE;

    if (NULL == dec) {
        mpp_err_f("found NULL intput dec %p cfg %p\n", dec, cfg);
        return MPP_ERR_NULL_PTR;
    }

    stream = mpp_malloc_size(RK_U8, stream_size);
    if (NULL == stream) {
        mpp_err_f("failed to malloc stream buffer size %d\n", stream_size);
        return MPP_ERR_MALLOC;
    }

    ret = mpp_packet_init(&task_pkt, stream, stream_size);
    if (ret) {
        mpp_err_f("failed to create mpp_packet for task\n");
        goto ERR_RET;
    }

    // reset task packet length to zero
    // NOTE: set length must after set pos
    mpp_packet_set_pos(task_pkt, stream);
    mpp_packet_set_length(task_pkt, 0);

    ret = mpp_mpg4_parser_init(&parser, cfg);
    if (ret) {
        mpp_err_f("failed to init parser\n");
        goto ERR_RET;
    }

    p = (Mpg4dCtx *)dec;
    p->frame_slots  = cfg->frame_slots;
    p->packet_slots = cfg->packet_slots;
    p->task_count   = 2;
    p->dec_cfg      = cfg->cfg;
    p->stream       = stream;
    p->stream_size  = stream_size;
    p->task_pkt     = task_pkt;
    p->parser       = parser;
    p->left_length  = 0;
    return MPP_OK;
ERR_RET:
    if (task_pkt) {
        mpp_packet_deinit(&task_pkt);
    }
    if (stream) {
        mpp_free(stream);
        stream = NULL;
    }
    return ret;
}